

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O0

bool __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
::ConvertToNLCon<mp::LinTerms,mp::AlgConRange>
          (Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *con,int param_3)

{
  double dVar1;
  double dVar2;
  AlgConRange rng_00;
  bool bVar3;
  bool bVar4;
  Arguments *lt_00;
  size_t sVar5;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *in_RSI;
  undefined8 in_RDI;
  AlgConRange AVar6;
  NLConstraint nlc;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> lc;
  bool need_nlc;
  int exprResVar;
  AlgConRange rng;
  LinearFunctionalConstraint exprTerm;
  LinTerms lt;
  undefined1 in_stack_00000a2f;
  LinTerms *in_stack_00000a30;
  undefined4 in_stack_fffffffffffff9e8;
  int in_stack_fffffffffffff9ec;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffff9f0;
  LinTerms *in_stack_fffffffffffff9f8;
  LinTerms *in_stack_fffffffffffffa00;
  undefined1 fSort;
  LinTerms *in_stack_fffffffffffffa08;
  undefined7 in_stack_fffffffffffffa10;
  undefined1 in_stack_fffffffffffffa17;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffffa18;
  AlgConRange *this_00;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffffa20;
  CtxVal local_594;
  undefined1 in_stack_fffffffffffffa93;
  undefined4 in_stack_fffffffffffffa94;
  int expr;
  NLConstraint *this_01;
  undefined4 uVar7;
  int var;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_02;
  LinTerms *in_stack_fffffffffffffb68;
  LinTerms *in_stack_fffffffffffffb70;
  Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_fffffffffffffb78;
  Context local_188;
  int local_184;
  AlgConRange local_180;
  AlgConRange local_170;
  AlgConRange local_160 [12];
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *local_18;
  byte local_1;
  
  uVar7 = (undefined4)in_RDI;
  var = (int)((ulong)in_RDI >> 0x20);
  this_02 = (FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             *)&stack0xffffffffffffff68;
  local_18 = in_RSI;
  LinTerms::LinTerms((LinTerms *)in_stack_fffffffffffff9f0);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>::GetBody(local_18);
  Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::ExtractLinAndExprArgs
            (in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
  AVar6 = AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>::GetRhsOrRange(local_18);
  local_170.ub_ = AVar6.ub_;
  local_170.lb_ = AVar6.lb_;
  this_01 = (NLConstraint *)AlgConRange::lb(&local_170);
  AVar6 = AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>::GetRhsOrRange(local_18);
  local_180.ub_ = AVar6.ub_;
  local_180.lb_ = AVar6.lb_;
  dVar1 = AlgConRange::ub(&local_180);
  AlgConRange::AlgConRange(local_160,(double)this_01,dVar1);
  local_184 = -1;
  lt_00 = LinearFunctionalConstraint::GetArguments((LinearFunctionalConstraint *)0x480c16);
  bVar3 = AlgebraicExpression<mp::LinTerms>::is_variable
                    ((AlgebraicExpression<mp::LinTerms> *)in_stack_fffffffffffff9f0);
  expr = CONCAT13(bVar3,(int3)in_stack_fffffffffffffa94);
  if (bVar3) {
    LinearFunctionalConstraint::GetArguments((LinearFunctionalConstraint *)0x480c50);
    local_184 = LinTerms::get_representing_variable((LinTerms *)0x480c67);
  }
  else {
    LinearFunctionalConstraint::GetArguments((LinearFunctionalConstraint *)0x480cc2);
    bVar3 = LinTerms::empty((LinTerms *)0x480cd9);
    if (!bVar3) {
      dVar1 = AlgConRange::lb(local_160);
      dVar2 = BasicFlatConverter::PracticallyMinusInf();
      if (dVar1 <= dVar2) {
        local_594 = CTX_NEG;
      }
      else {
        dVar1 = AlgConRange::ub(local_160);
        dVar2 = BasicFlatConverter::PracticallyInf();
        local_594 = CTX_POS;
        if (dVar1 < dVar2) {
          local_594 = CTX_MIX;
        }
      }
      Context::Context(&local_188,local_594);
      FunctionalConstraint::AddContext
                ((FunctionalConstraint *)
                 CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                 (Context)(CtxVal)((ulong)in_stack_fffffffffffff9f0 >> 0x20));
      local_184 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                  ::AssignResultVar2Args<mp::LinearFunctionalConstraint>
                            (in_stack_fffffffffffffa18,
                             (LinearFunctionalConstraint *)
                             CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10));
    }
  }
  bVar3 = false;
  if (-1 < local_184) {
    bVar4 = FlatModel<mp::DefaultFlatModelParams>::VarHasMarking
                      (&in_stack_fffffffffffff9f0->super_FlatModel<mp::DefaultFlatModelParams>,
                       in_stack_fffffffffffff9ec);
    if (!bVar4) {
      FlatModel<mp::DefaultFlatModelParams>::MarkAsExpression
                (&in_stack_fffffffffffff9f0->super_FlatModel<mp::DefaultFlatModelParams>,
                 in_stack_fffffffffffff9ec);
    }
    bVar4 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            ::UserAcceptsAndRecommends<mp::NLConstraint>
                      (in_stack_fffffffffffff9f0,
                       (NLConstraint *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8)
                      );
    if (!bVar4) {
      FlatModel<mp::DefaultFlatModelParams>::MarkAsResultVar
                (&in_stack_fffffffffffff9f0->super_FlatModel<mp::DefaultFlatModelParams>,
                 in_stack_fffffffffffff9ec);
    }
    bVar4 = FlatModel<mp::DefaultFlatModelParams>::IsProperVar
                      (&in_stack_fffffffffffff9f0->super_FlatModel<mp::DefaultFlatModelParams>,
                       in_stack_fffffffffffff9ec);
    if (bVar4) {
      LinTerms::add_term(in_stack_fffffffffffffa00,(double)in_stack_fffffffffffff9f8,
                         (int)((ulong)in_stack_fffffffffffff9f0 >> 0x20));
      LinTerms::sort_terms(in_stack_00000a30,(bool)in_stack_00000a2f);
      sVar5 = LinTerms::size((LinTerms *)0x480eb5);
      if (sVar5 < 2) {
        this_00 = local_160;
        AlgConRange::lb(this_00);
        AlgConRange::ub(this_00);
        FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
        ::NarrowVarBounds(this_02,var,(double)this_01,(double)lt_00);
        local_1 = 1;
        goto LAB_00481224;
      }
      bVar3 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
              ::UserAcceptsAndRecommends<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRange>>
                        (in_stack_fffffffffffff9f0,
                         (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *)
                         CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
      if (bVar3) {
        LinTerms::LinTerms(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
        fSort = (undefined1)((ulong)in_stack_fffffffffffffa00 >> 0x38);
        AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>::GetRhsOrRange(local_18);
        AVar6.ub_ = (double)in_stack_fffffffffffffa20;
        AVar6.lb_ = (double)in_stack_fffffffffffffa18;
        AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>::AlgebraicConstraint
                  ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *)
                   CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10),
                   in_stack_fffffffffffffa08,AVar6,(bool)fSort);
        LinTerms::~LinTerms((LinTerms *)in_stack_fffffffffffff9f0);
        AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>::AlgebraicConstraint
                  ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *)in_stack_fffffffffffff9f0,
                   (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *)
                   CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
        FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
        ::AddConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRange>>
                  (in_stack_fffffffffffffa20,
                   (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *)in_stack_fffffffffffffa18);
        AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>::~AlgebraicConstraint
                  ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *)in_stack_fffffffffffff9f0);
        local_1 = 1;
        AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>::~AlgebraicConstraint
                  ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *)in_stack_fffffffffffff9f0);
        goto LAB_00481224;
      }
      bVar3 = true;
      local_184 = -1;
    }
  }
  if (((-1 < local_184) ||
      (bVar4 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
               ::UserAcceptsAndRecommends<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRange>>
                         (in_stack_fffffffffffff9f0,
                          (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *)
                          CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8)), !bVar4))
     || (bVar3)) {
    rng_00.lb_._4_4_ = var;
    rng_00.lb_._0_4_ = uVar7;
    rng_00.ub_ = (double)this_02;
    NLConstraint::NLConstraint
              (this_01,&lt_00->super_LinTerms,expr,rng_00,(bool)in_stack_fffffffffffffa93);
    in_stack_fffffffffffff9f0 =
         (FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          *)(CONCAT44(var,uVar7) + -0x208);
    NLConstraint::NLConstraint
              ((NLConstraint *)in_stack_fffffffffffff9f0,
               (NLConstraint *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
    FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::AddConstraint<mp::NLConstraint>
              (in_stack_fffffffffffffa20,(NLConstraint *)in_stack_fffffffffffffa18);
    NLConstraint::~NLConstraint((NLConstraint *)in_stack_fffffffffffff9f0);
    local_1 = 1;
    NLConstraint::~NLConstraint((NLConstraint *)in_stack_fffffffffffff9f0);
  }
  else {
    local_1 = 0;
  }
LAB_00481224:
  LinearFunctionalConstraint::~LinearFunctionalConstraint
            ((LinearFunctionalConstraint *)in_stack_fffffffffffff9f0);
  LinTerms::~LinTerms((LinTerms *)in_stack_fffffffffffff9f0);
  return (bool)(local_1 & 1);
}

Assistant:

bool ConvertToNLCon(
      const AlgebraicConstraint<Body, RhsOrRange>& con, int ) {
    LinTerms lt;
    /// exprTerm will be a LinearFunctionalConstraint or a Quadratic...
    auto exprTerm = ExtractLinAndExprArgs(con.GetBody(), lt);
    assert(0.0 == exprTerm.GetArguments().constant_term());
    AlgConRange rng { con.GetRhsOrRange().lb(), con.GetRhsOrRange().ub() };
    /// Store full LFC only if it is not 1.0*var
    int exprResVar = -1;
    if (exprTerm.GetArguments().is_variable()) {
      exprResVar = exprTerm.GetArguments().get_representing_variable();
    } else if ( !exprTerm.GetArguments().empty() ) {  // has more terms, or coef != 1.0
      exprTerm.AddContext(                            // Context is compulsory
          rng.lb() > MPCD( PracticallyMinusInf() )    // Should not need to propagate
          ? (rng.ub() < MPCD( PracticallyInf() )
                ? Context::CTX_MIX : Context::CTX_POS)
              : Context::CTX_NEG);
      exprResVar = MPD( AssignResultVar2Args(std::move(exprTerm)) );
    }
    bool need_nlc {false};
    if (exprResVar >= 0) {                            // Some expressions are there
      if (!MPCD(VarHasMarking(exprResVar)))             // mark as expr if new
        MPD( MarkAsExpression(exprResVar) );
      if ( !MPCD( UserAcceptsAndRecommends((const NLConstraint*)nullptr) ) )
        MPD( MarkAsResultVar(exprResVar) );
      /// Exists and marked a variable
      if (MPCD( IsProperVar(exprResVar) )) {            // Not an expression after all
        lt.add_term(1.0, exprResVar);        // @todo When exprTerm was originally a var,
        lt.sort_terms();                     // this would reproduce the original con.
        if (lt.size()>1) {                              // ... has other variables
          if (MPCD( UserAcceptsAndRecommends(       // Accepts LinCon..
                  (const AlgebraicConstraint<LinTerms, RhsOrRange>*)nullptr) )) {
            AlgebraicConstraint<LinTerms, RhsOrRange> lc {lt, con.GetRhsOrRange(), false};
            MPD( AddConstraint( std::move(lc) ) );
            return true;
          }
          need_nlc = true;
        } else {         // single variable, its expression will be explicified
          MPD( NarrowVarBounds(exprResVar, rng.lb(), rng.ub()) );
          return true;
        }
        exprResVar = -1;                                // no expression
      }
    }
    if (0<=exprResVar                                   // either: have expression
        || !MPCD( UserAcceptsAndRecommends(         // or, not accepts source \a con
            (const AlgebraicConstraint<Body, RhsOrRange>*)nullptr) )
        || need_nlc) {                                  // or, other reason
      assert( MPCD( UserAcceptsAndRecommends((const NLConstraint*)nullptr) ) );
      NLConstraint nlc{lt, exprResVar, rng, false};     // false: no sort any more
      MPD( AddConstraint( std::move(nlc) ) );
      return true;
    }
    return false;
  }